

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O2

void Kf_ManSaveResults(Kf_Cut_t **ppCuts,int nCuts,Kf_Cut_t *pCutBest,Vec_Int_t *vTemp)

{
  uint Entry;
  int iVar1;
  Kf_Cut_t *pKVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (0x1e < nCuts - 1U) {
    __assert_fail("nCuts > 0 && nCuts < KF_CUT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaKf.c"
                  ,0xce,"void Kf_ManSaveResults(Kf_Cut_t **, int, Kf_Cut_t *, Vec_Int_t *)");
  }
  Kf_ManStoreStart(vTemp,nCuts);
  for (uVar5 = 0; uVar5 != (uint)nCuts; uVar5 = uVar5 + 1) {
    pKVar2 = ppCuts[uVar5];
    if (pKVar2 == pCutBest) {
      Vec_IntWriteEntry(vTemp,1,vTemp->nSize);
      pKVar2 = ppCuts[uVar5];
    }
    uVar4 = (ulong)(uint)pKVar2->nLeaves;
    Vec_IntPush(vTemp,pKVar2->nLeaves);
    for (lVar3 = 0; pKVar2 = ppCuts[uVar5], lVar3 < pKVar2->nLeaves; lVar3 = lVar3 + 1) {
      Entry = Abc_Var2Lit(pKVar2->pLeaves[lVar3],(int)uVar4);
      uVar4 = (ulong)Entry;
      Vec_IntPush(vTemp,Entry);
    }
    Vec_IntPush(vTemp,pKVar2->iFunc);
    Vec_IntPush(vTemp,ppCuts[uVar5]->Delay);
    Vec_IntPush(vTemp,(int)ppCuts[uVar5]->Area);
  }
  iVar1 = Vec_IntEntry(vTemp,1);
  if (0 < iVar1) {
    return;
  }
  __assert_fail("Vec_IntEntry(vTemp, 1) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaKf.c"
                ,0xdc,"void Kf_ManSaveResults(Kf_Cut_t **, int, Kf_Cut_t *, Vec_Int_t *)");
}

Assistant:

static inline void Kf_ManSaveResults( Kf_Cut_t ** ppCuts, int nCuts, Kf_Cut_t * pCutBest, Vec_Int_t * vTemp )
{
    int i, k;
    assert( nCuts > 0 && nCuts < KF_CUT_MAX );
    Kf_ManStoreStart( vTemp, nCuts );
    for ( i = 0; i < nCuts; i++ )
    {
        if ( ppCuts[i] == pCutBest )
            Vec_IntWriteEntry( vTemp, 1, Vec_IntSize(vTemp) );
        Vec_IntPush( vTemp, ppCuts[i]->nLeaves );
//        Vec_IntPushArray( vTemp, ppCuts[i]->pLeaves, ppCuts[i]->nLeaves );
        for ( k = 0; k < ppCuts[i]->nLeaves; k++ )
            Vec_IntPush( vTemp, Abc_Var2Lit(ppCuts[i]->pLeaves[k], 0) );
        Vec_IntPush( vTemp, ppCuts[i]->iFunc );
        Vec_IntPush( vTemp, ppCuts[i]->Delay );
        Vec_IntPush( vTemp, Abc_Float2Int(ppCuts[i]->Area) );
    }
    assert( Vec_IntEntry(vTemp, 1) > 0 );
}